

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

wchar_t detect_form(archive_read *a,wchar_t *is_form_d)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  wchar_t wVar7;
  uint uVar8;
  wchar_t wVar9;
  byte *b;
  size_t sVar10;
  void *pvVar11;
  ulong uVar12;
  size_t sVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  int iVar17;
  ulong uVar18;
  long len;
  ssize_t sVar19;
  byte *p;
  size_t sVar20;
  size_t unaff_R13;
  ssize_t avail;
  ssize_t nl;
  size_t local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  archive_read *local_40;
  wchar_t *local_38;
  
  if (is_form_d != (wchar_t *)0x0) {
    *is_form_d = L'\0';
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    return L'\xffffffff';
  }
  iVar17 = 0;
  local_50 = 0;
  local_4c = 0;
  sVar20 = local_58;
  local_38 = is_form_d;
LAB_0058f0ff:
  do {
    if (local_58 == 0) {
      local_48 = 0;
      sVar10 = 0;
    }
    else {
      sVar10 = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
    }
    bVar3 = false;
    sVar13 = sVar20;
    do {
      sVar4 = local_58;
      sVar20 = sVar13;
      sVar5 = sVar10;
      if (((local_48 != 0) || (sVar10 != local_58)) || (bVar3)) break;
      if ((long)sVar10 < 0x100000) {
        uVar18 = (ulong)((int)sVar13 + 0x3ffU & 0xfffffc00);
        pvVar11 = __archive_read_ahead
                            (local_40,uVar18 << (uVar18 < sVar13 + 0xa0),(ssize_t *)&local_58);
        if (pvVar11 == (void *)0x0) {
          if ((long)local_58 <= (long)sVar13) {
            unaff_R13 = 0;
            b = (byte *)0x0;
            goto LAB_0058f15c;
          }
          pvVar11 = __archive_read_ahead(local_40,local_58,(ssize_t *)&local_58);
          bVar3 = true;
        }
        sVar20 = local_58;
        b = (byte *)((long)pvVar11 + (sVar13 - sVar4));
        local_58 = local_58 - (sVar13 - sVar4);
        sVar19 = get_line_size((char *)(b + sVar10),local_58 - sVar10,(ssize_t *)&local_48);
        sVar13 = 0;
        if (-1 < sVar19) {
          sVar13 = sVar10;
        }
        sVar10 = sVar13 + sVar19;
        bVar2 = true;
      }
      else {
        unaff_R13 = 0xffffffffffffffff;
LAB_0058f15c:
        bVar2 = false;
      }
      sVar13 = sVar20;
      sVar5 = unaff_R13;
    } while (bVar2);
    unaff_R13 = sVar5;
    uVar18 = local_48;
    iVar6 = local_50;
    if (((long)unaff_R13 < 1) || (local_48 == 0)) goto LAB_0058f5af;
    if (local_50 == 0) {
      bVar3 = 0 < (long)unaff_R13;
      if (0 < (long)unaff_R13) {
        pbVar16 = b + unaff_R13;
        do {
          sVar10 = local_58 - 1;
          if ((*b != 0x20) && (*b != 9)) goto LAB_0058f274;
          b = b + 1;
          bVar3 = 1 < (long)unaff_R13;
          bVar2 = 1 < (long)unaff_R13;
          unaff_R13 = unaff_R13 - 1;
          local_58 = sVar10;
        } while (bVar2);
        unaff_R13 = 0;
        b = pbVar16;
      }
LAB_0058f274:
      bVar1 = *b;
      if (bVar1 < 0x23) {
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_0058f290:
          b = b + unaff_R13;
          local_58 = local_58 - unaff_R13;
          goto LAB_0058f0ff;
        }
LAB_0058f393:
        pbVar16 = b + unaff_R13;
        wVar7 = L'\0';
        bVar2 = false;
        p = b;
        if (bVar3) {
          uVar12 = (ulong)*b;
          if (bid_entry_safe_char[uVar12] == '\0') {
            bVar2 = false;
          }
          else {
            do {
              p = p + 1;
              if (pbVar16 <= p) {
                bVar2 = true;
                goto LAB_0058f410;
              }
              uVar12 = (ulong)*p;
            } while (bid_entry_safe_char[uVar12] != '\0');
            bVar2 = true;
          }
          if ((0x20 < (byte)uVar12) || ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0)) {
            bVar2 = false;
          }
        }
LAB_0058f410:
        sVar19 = (long)pbVar16 - (long)p;
        if (bVar2) {
LAB_0058f50a:
          wVar9 = bid_keyword_list((char *)p,sVar19,L'\0',wVar7);
        }
        else {
          pbVar15 = pbVar16 + -local_48;
          if (((pbVar16 + -local_48 + -2 < b) || (pbVar15[-1] != 0x5c)) ||
             ((bVar1 = pbVar16[-local_48 + -2], bVar1 != 9 && (bVar1 != 0x20)))) {
            pbVar14 = pbVar15 + -1;
            bVar3 = true;
            if (pbVar14 < b) {
              uVar8 = 0;
LAB_0058f463:
              if ((uVar8 == 0) || (bVar3)) goto LAB_0058f4fd;
              wVar7 = L'\0';
              bVar2 = false;
              if (*pbVar15 != 0x2f) {
                sVar19 = unaff_R13 - (uVar8 + local_48);
                bVar2 = true;
                wVar7 = L'\x01';
                p = b;
              }
            }
            else {
              bVar2 = false;
              if (*pbVar14 != 0x5c) {
                uVar8 = 0;
                if (b <= pbVar14) {
                  bVar3 = false;
                  uVar8 = 0;
                  do {
                    bVar1 = *pbVar14;
                    if ((bVar1 == 9) || (bVar1 == 0x20)) break;
                    if (bid_entry_safe_char[bVar1] == '\0') goto LAB_0058f4fd;
                    uVar8 = uVar8 + 1;
                    if (bVar1 == 0x2f) {
                      bVar3 = true;
                    }
                    pbVar14 = pbVar14 + -1;
                  } while (b <= pbVar14);
                  pbVar15 = pbVar14 + 1;
                  bVar3 = !bVar3;
                }
                goto LAB_0058f463;
              }
              wVar7 = L'\0';
            }
          }
          else {
LAB_0058f4fd:
            wVar7 = L'\0';
            bVar2 = false;
          }
          wVar9 = L'\xffffffff';
          if (bVar2) goto LAB_0058f50a;
        }
        if (wVar9 < L'\0') {
LAB_0058f552:
          bVar3 = false;
        }
        else {
          if (local_4c == 1) {
            local_4c = 1;
            if ((wVar7 == L'\0') && (wVar9 != L'\0')) goto LAB_0058f552;
          }
          else if ((local_4c == 0) && (local_4c = 1, wVar7 == L'\0')) {
            local_4c = -(uint)(wVar9 != L'\0');
          }
          if ((wVar7 == L'\0') && (pbVar16[~uVar18] == 0x5c)) {
            bVar3 = true;
            local_50 = 1;
          }
          else {
            bVar3 = iVar17 < 2;
            iVar17 = iVar17 + 1;
          }
        }
        if (!bVar3) goto LAB_0058f5af;
      }
      else {
        if (bVar1 == 0x23) goto LAB_0058f290;
        if (bVar1 != 0x2f) goto LAB_0058f393;
        if (((long)unaff_R13 < 5) || (iVar6 = strncmp((char *)b,"/set",4), iVar6 != 0)) {
          if (6 < (long)unaff_R13) {
            iVar6 = strncmp((char *)b,"/unset",6);
            if (iVar6 == 0) {
              pbVar16 = b + 6;
              len = unaff_R13 - 6;
              wVar7 = L'\x01';
              goto LAB_0058f34f;
            }
LAB_0058f5a4:
            unaff_R13 = 1;
          }
LAB_0058f5af:
          if (iVar17 < 3) {
            if (unaff_R13 != 0) {
              return L'\0';
            }
            if (iVar17 < 1) {
              return L'\0';
            }
          }
          if (local_38 == (wchar_t *)0x0) {
            return L' ';
          }
          if (local_4c != 1) {
            return L' ';
          }
          *local_38 = L'\x01';
          return L' ';
        }
        pbVar16 = b + 4;
        len = unaff_R13 - 4;
        wVar7 = L'\0';
LAB_0058f34f:
        wVar7 = bid_keyword_list((char *)pbVar16,len,wVar7,L'\0');
        if (wVar7 < L'\x01') goto LAB_0058f5a4;
        if (b[~uVar18 + unaff_R13] == 0x5c) {
          local_50 = 2;
        }
      }
      b = b + unaff_R13;
      local_58 = local_58 - unaff_R13;
      goto LAB_0058f0ff;
    }
    wVar7 = bid_keyword_list((char *)b,unaff_R13,L'\0',L'\0');
    if (wVar7 < L'\x01') goto LAB_0058f5af;
    b = b + unaff_R13;
    local_50 = iVar6;
    if ((b[~uVar18] != 0x5c) && (local_50 = 0, iVar6 == 1)) {
      iVar6 = iVar17 + 1;
      bVar3 = 1 < iVar17;
      iVar17 = iVar6;
      local_50 = 0;
      if (bVar3) goto LAB_0058f5af;
    }
    local_58 = local_58 - unaff_R13;
  } while( true );
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}